

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O3

bool google::protobuf::internal::
     HandleString<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandler,(google::protobuf::internal::Cardinality)1,false,(google::protobuf::internal::StringType)0>
               (CodedInputStream *input,MessageLite *msg,Arena *arena,uint32 *has_bits,
               uint32 has_bit_index,int64 offset,void *default_ptr,char *field_name)

{
  RepeatedPtrFieldBase *this;
  int iVar1;
  Arena *this_00;
  bool bVar2;
  Rep *pRVar3;
  string *value;
  int iVar4;
  
  this = (RepeatedPtrFieldBase *)
         ((long)&(arena->impl_).threads_._M_b._M_p + (long)&msg->_vptr_MessageLite);
  pRVar3 = *(Rep **)((long)&(arena->impl_).threads_._M_b._M_p + (long)&msg[1]._vptr_MessageLite);
  if (pRVar3 == (Rep *)0x0) {
    iVar4 = this->total_size_;
LAB_0020adea:
    RepeatedPtrFieldBase::Reserve(this,iVar4 + 1);
    pRVar3 = this->rep_;
    iVar4 = pRVar3->allocated_size;
  }
  else {
    iVar1 = this->current_size_;
    iVar4 = pRVar3->allocated_size;
    if (iVar1 < iVar4) {
      this->current_size_ = iVar1 + 1;
      value = (string *)pRVar3->elements[iVar1];
      goto LAB_0020ae51;
    }
    if (iVar4 == this->total_size_) goto LAB_0020adea;
  }
  pRVar3->allocated_size = iVar4 + 1;
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    value = (string *)operator_new(0x20);
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    value = (string *)
            ArenaImpl::AllocateAlignedAndAddCleanup
                      (&this_00->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (value->_M_dataplus)._M_p = (pointer)&value->field_2;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  iVar4 = this->current_size_;
  this->current_size_ = iVar4 + 1;
  this->rep_->elements[iVar4] = value;
LAB_0020ae51:
  bVar2 = WireFormatLite::ReadBytes(input,value);
  if ((bVar2) && ((long)value->_M_string_length < 0)) {
    StringPiece::LogFatalSizeTooBig(value->_M_string_length,"size_t to int conversion");
  }
  return bVar2;
}

Assistant:

static inline bool HandleString(io::CodedInputStream* input, MessageLite* msg,
                                Arena* arena, uint32* has_bits,
                                uint32 has_bit_index, int64 offset,
                                const void* default_ptr,
                                const char* field_name) {
  StringPiece utf8_string_data;
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
  constexpr bool kValidateUtf8 = is_string_type;
#else
  constexpr bool kValidateUtf8 = false;
#endif  // GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED

  switch (ctype) {
    case StringType_INLINED: {
      InlinedStringField* s = nullptr;
      switch (cardinality) {
        case Cardinality_SINGULAR:
          // TODO(ckennelly): Is this optimal?
          s = MutableField<InlinedStringField>(msg, has_bits, has_bit_index,
                                               offset);
          break;
        case Cardinality_REPEATED:
          s = AddField<InlinedStringField>(msg, offset);
          break;
        case Cardinality_ONEOF:
          s = Raw<InlinedStringField>(msg, offset);
          break;
      }
      GOOGLE_DCHECK(s != nullptr);
      std::string* value = s->MutableNoArena(NULL);
      if (PROTOBUF_PREDICT_FALSE(!WireFormatLite::ReadString(input, value))) {
        return false;
      }
      utf8_string_data = *value;
      break;
    }
    case StringType_STRING: {
      switch (cardinality) {
        case Cardinality_SINGULAR: {
          ArenaStringPtr* field = MutableField<ArenaStringPtr>(
              msg, has_bits, has_bit_index, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        case Cardinality_REPEATED: {
          std::string* value = AddField<std::string>(msg, offset);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = *value;
        } break;
        case Cardinality_ONEOF: {
          ArenaStringPtr* field = Raw<ArenaStringPtr>(msg, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        default:
          PROTOBUF_ASSUME(false);
      }
      break;
    }
    default:
      PROTOBUF_ASSUME(false);
  }

  if (kValidateUtf8) {
    // TODO(b/118759213): fail if proto3
    WireFormatLite::VerifyUtf8String(utf8_string_data.data(),
                                     utf8_string_data.length(),
                                     WireFormatLite::PARSE, field_name);
  }
  return true;
}